

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqpvalue.c
# Opt level: O2

int encode_float_value(AMQPVALUE_ENCODER_OUTPUT encoder_output,void *context,float value)

{
  int iVar1;
  LOGGER_LOG p_Var2;
  uchar local_1c;
  uchar local_1b;
  uchar local_1a;
  uchar local_19;
  
  local_1b = (uchar)((uint)value >> 0x18);
  iVar1 = (*encoder_output)(context,&local_1b,1);
  if (iVar1 == 0) {
    local_1a = (uchar)((uint)value >> 0x10);
    iVar1 = (*encoder_output)(context,&local_1a,1);
    if (iVar1 == 0) {
      local_1c = (uchar)((uint)value >> 8);
      iVar1 = (*encoder_output)(context,&local_1c,1);
      if (iVar1 == 0) {
        local_19 = SUB41(value,0);
        iVar1 = (*encoder_output)(context,&local_19,1);
        if (iVar1 == 0) {
          return 0;
        }
      }
    }
  }
  p_Var2 = xlogging_get_log_function();
  if (p_Var2 != (LOGGER_LOG)0x0) {
    (*p_Var2)(AZ_LOG_ERROR,
              "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/amqpvalue.c"
              ,"encode_float_value",0xc5f,1,"Failure encoding bytes for float");
  }
  return 0xc60;
}

Assistant:

static int encode_float_value(AMQPVALUE_ENCODER_OUTPUT encoder_output, void* context, float value)
{
    int result;

    uint32_t value_as_uint32 = *((uint32_t*)(void*)&value);
    /* Codes_SRS_AMQPVALUE_01_289: [\<encoding name="ieee-754" code="0x72" category="fixed" width="4" label="IEEE 754-2008 binary32"/>] */
    if ((output_byte(encoder_output, context, (value_as_uint32 >> 24) & 0xFF) != 0) ||
        (output_byte(encoder_output, context, (value_as_uint32 >> 16) & 0xFF) != 0) ||
        (output_byte(encoder_output, context, (value_as_uint32 >> 8) & 0xFF) != 0) ||
        (output_byte(encoder_output, context, (value_as_uint32) & 0xFF) != 0))
    {
        /* Codes_SRS_AMQPVALUE_01_274: [When the encoder output function fails, amqpvalue_encode shall fail and return a non-zero value.] */
        LogError("Failure encoding bytes for float");
        result = MU_FAILURE;
    }
    else
    {
        /* Codes_SRS_AMQPVALUE_01_266: [On success amqpvalue_encode shall return 0.] */
        result = 0;
    }

    return result;
}